

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

uint8 * __thiscall
google::protobuf::GeneratedCodeInfo_Annotation::_InternalSerialize
          (GeneratedCodeInfo_Annotation *this,uint8 *target,EpsCopyOutputStream *stream)

{
  uint *puVar1;
  string *psVar2;
  void *pvVar3;
  bool bVar4;
  LogMessage *other;
  ulong uVar5;
  ulong uVar6;
  byte *pbVar7;
  uint *puVar8;
  uint uVar9;
  uint uVar10;
  LogMessage local_70;
  LogFinisher local_31;
  
  uVar10 = (this->_path_cached_byte_size_).super___atomic_base<int>._M_i;
  if (0 < (int)uVar10) {
    pbVar7 = stream->end_;
    if (pbVar7 <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      pbVar7 = stream->end_;
    }
    if (pbVar7 <= target) {
      internal::LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/io/coded_stream.h"
                 ,0x35a);
      other = internal::LogMessage::operator<<(&local_70,"CHECK failed: ptr < end_: ");
      internal::LogFinisher::operator=(&local_31,other);
      internal::LogMessage::~LogMessage(&local_70);
    }
    *target = 10;
    pbVar7 = target + 1;
    uVar9 = uVar10;
    if (0x7f < uVar10) {
      do {
        target = pbVar7;
        *target = (byte)uVar9 | 0x80;
        uVar10 = uVar9 >> 7;
        pbVar7 = target + 1;
        bVar4 = 0x3fff < uVar9;
        uVar9 = uVar10;
      } while (bVar4);
    }
    target = target + 2;
    *pbVar7 = (byte)uVar10;
    puVar8 = (uint *)(this->path_).arena_or_elements_;
    puVar1 = puVar8 + (this->path_).current_size_;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar10 = *puVar8;
      if ((ulong)(long)(int)uVar10 < 0x80) {
        *target = (byte)uVar10;
        target = target + 1;
      }
      else {
        *target = (byte)uVar10 | 0x80;
        uVar5 = (ulong)(long)(int)uVar10 >> 7;
        if (uVar10 < 0x4000) {
          target[1] = (byte)uVar5;
          target = target + 2;
        }
        else {
          target = target + 2;
          do {
            pbVar7 = target;
            pbVar7[-1] = (byte)uVar5 | 0x80;
            uVar6 = uVar5 >> 7;
            target = pbVar7 + 1;
            bVar4 = 0x3fff < uVar5;
            uVar5 = uVar6;
          } while (bVar4);
          *pbVar7 = (byte)uVar6;
        }
      }
      puVar8 = puVar8 + 1;
    } while (puVar8 < puVar1);
  }
  uVar10 = (this->_has_bits_).has_bits_[0];
  if ((uVar10 & 1) != 0) {
    psVar2 = (this->source_file_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "google.protobuf.GeneratedCodeInfo.Annotation.source_file");
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,2,(this->source_file_).ptr_,target);
  }
  if ((uVar10 & 2) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar9 = this->begin_;
    *target = 0x18;
    if ((ulong)(long)(int)uVar9 < 0x80) {
      target[1] = (byte)uVar9;
      target = target + 2;
    }
    else {
      target[1] = (byte)uVar9 | 0x80;
      uVar5 = (ulong)(long)(int)uVar9 >> 7;
      if (uVar9 < 0x4000) {
        target[2] = (byte)uVar5;
        target = target + 3;
      }
      else {
        target = target + 3;
        do {
          pbVar7 = target;
          pbVar7[-1] = (byte)uVar5 | 0x80;
          uVar6 = uVar5 >> 7;
          target = pbVar7 + 1;
          bVar4 = 0x3fff < uVar5;
          uVar5 = uVar6;
        } while (bVar4);
        *pbVar7 = (byte)uVar6;
      }
    }
  }
  if ((uVar10 & 4) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar10 = this->end_;
    *target = 0x20;
    if ((ulong)(long)(int)uVar10 < 0x80) {
      target[1] = (byte)uVar10;
      target = target + 2;
    }
    else {
      target[1] = (byte)uVar10 | 0x80;
      uVar5 = (ulong)(long)(int)uVar10 >> 7;
      if (uVar10 < 0x4000) {
        target[2] = (byte)uVar5;
        target = target + 3;
      }
      else {
        target = target + 3;
        do {
          pbVar7 = target;
          pbVar7[-1] = (byte)uVar5 | 0x80;
          uVar6 = uVar5 >> 7;
          target = pbVar7 + 1;
          bVar4 = 0x3fff < uVar5;
          uVar5 = uVar6;
        } while (bVar4);
        *pbVar7 = (byte)uVar6;
      }
    }
  }
  pvVar3 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    target = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)(((ulong)pvVar3 & 0xfffffffffffffffe) + 8),target,stream)
    ;
  }
  return target;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* GeneratedCodeInfo_Annotation::_InternalSerialize(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.GeneratedCodeInfo.Annotation)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated int32 path = 1 [packed = true];
  {
    int byte_size = _path_cached_byte_size_.load(std::memory_order_relaxed);
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          1, _internal_path(), byte_size, target);
    }
  }

  cached_has_bits = _has_bits_[0];
  // optional string source_file = 2;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_source_file().data(), static_cast<int>(this->_internal_source_file().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.GeneratedCodeInfo.Annotation.source_file");
    target = stream->WriteStringMaybeAliased(
        2, this->_internal_source_file(), target);
  }

  // optional int32 begin = 3;
  if (cached_has_bits & 0x00000002u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(3, this->_internal_begin(), target);
  }

  // optional int32 end = 4;
  if (cached_has_bits & 0x00000004u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(4, this->_internal_end(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(::PROTOBUF_NAMESPACE_ID::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.GeneratedCodeInfo.Annotation)
  return target;
}